

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dummyCommandQueue(CLIntercept *this,cl_context context,cl_device_id device)

{
  cl_command_queue p_Var1;
  float __x;
  double __x_00;
  cl_int errorCode;
  string local_48;
  cl_command_queue_properties props;
  
  if ((this->m_Config).DummyOutOfOrderQueue == true) {
    (*(this->m_Dispatch).clGetDeviceInfo)(device,0x102a,8,&props,(size_t *)0x0);
    if (((byte)props & 1) != 0) {
      std::mutex::lock(&this->m_Mutex);
      __x_00 = (double)std::__cxx11::string::string
                                 ((string *)&local_48,
                                  "Creating and destroying a dummy out-of-order queue.\n",
                                  (allocator *)&errorCode);
      log(this,__x_00);
      std::__cxx11::string::~string((string *)&local_48);
      errorCode = 0;
      p_Var1 = (*(this->m_Dispatch).clCreateCommandQueue)(context,device,1,&errorCode);
      if (errorCode == 0) {
        (*(this->m_Dispatch).clReleaseCommandQueue)(p_Var1);
      }
      else {
        CEnumNameMap::name_abi_cxx11_(&local_48,&this->m_EnumNameMap,errorCode);
        logf(this,__x);
        std::__cxx11::string::~string((string *)&local_48);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    }
  }
  return;
}

Assistant:

void CLIntercept::dummyCommandQueue(
    cl_context context,
    cl_device_id device )
{
    if( config().DummyOutOfOrderQueue )
    {
        cl_command_queue_properties props;
        dispatch().clGetDeviceInfo(
            device,
            CL_DEVICE_QUEUE_ON_HOST_PROPERTIES,
            sizeof(props),
            &props,
            NULL );
        if( props & CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE )
        {
            std::lock_guard<std::mutex> lock(m_Mutex);

            log( "Creating and destroying a dummy out-of-order queue.\n" );

            cl_int  errorCode = CL_SUCCESS;
            cl_command_queue dummy = dispatch().clCreateCommandQueue(
                context,
                device,
                CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE,
                &errorCode );
            if( errorCode == CL_SUCCESS )
            {
                dispatch().clReleaseCommandQueue( dummy );
            }
            else
            {
                logf( "Error creating dummy command queue!  %s (%i)\n",
                    enumName().name( errorCode ).c_str(),
                    errorCode );
            }
        }
    }
}